

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O1

xmlParserErrors xmlNewInputFromUrl(char *filename,xmlParserInputFlags flags,xmlParserInputPtr *out)

{
  xmlParserErrors xVar1;
  xmlParserInputBufferCreateFilenameFunc *pp_Var2;
  xmlParserInputPtr pxVar3;
  xmlParserInputBufferPtr buf;
  xmlParserInputBufferPtr local_20;
  
  xVar1 = XML_ERR_ARGUMENT;
  if ((out != (xmlParserInputPtr *)0x0) && (*out = (xmlParserInputPtr)0x0, filename != (char *)0x0))
  {
    pp_Var2 = __xmlParserInputBufferCreateFilenameValue();
    if (*pp_Var2 == (xmlParserInputBufferCreateFilenameFunc)0x0) {
      xVar1 = xmlParserInputBufferCreateUrl(filename,XML_CHAR_ENCODING_NONE,flags,&local_20);
    }
    else {
      pp_Var2 = __xmlParserInputBufferCreateFilenameValue();
      local_20 = (**pp_Var2)(filename,XML_CHAR_ENCODING_NONE);
      xVar1 = XML_IO_ENOENT;
      if (local_20 != (xmlParserInputBufferPtr)0x0) {
        xVar1 = XML_ERR_OK;
      }
    }
    if (xVar1 == XML_ERR_OK) {
      pxVar3 = xmlNewInputInternal(local_20,filename);
      if (pxVar3 == (xmlParserInputPtr)0x0) {
        xVar1 = XML_ERR_NO_MEMORY;
      }
      else {
        *out = pxVar3;
        xVar1 = XML_ERR_OK;
      }
    }
  }
  return xVar1;
}

Assistant:

xmlParserErrors
xmlNewInputFromUrl(const char *filename, xmlParserInputFlags flags,
                   xmlParserInputPtr *out) {
    xmlParserInputBufferPtr buf;
    xmlParserInputPtr input;
    xmlParserErrors code = XML_ERR_OK;

    if (out == NULL)
        return(XML_ERR_ARGUMENT);
    *out = NULL;
    if (filename == NULL)
        return(XML_ERR_ARGUMENT);

    if (xmlParserInputBufferCreateFilenameValue != NULL) {
        buf = xmlParserInputBufferCreateFilenameValue(filename,
                XML_CHAR_ENCODING_NONE);
        if (buf == NULL)
            code = XML_IO_ENOENT;
    } else {
        code = xmlParserInputBufferCreateUrl(filename, XML_CHAR_ENCODING_NONE,
                                             flags, &buf);
    }
    if (code != XML_ERR_OK)
	return(code);

    input = xmlNewInputInternal(buf, filename);
    if (input == NULL)
	return(XML_ERR_NO_MEMORY);

    *out = input;
    return(XML_ERR_OK);
}